

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateProgramOutputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  NodeType NVar1;
  ShaderType SVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  Node *pNVar6;
  deInt32 *pdVar7;
  SharedPtr variable;
  SharedPtr variable_3;
  SharedPtr layout;
  SharedPtr variable_5;
  SharedPtr output;
  undefined1 local_a8 [8];
  SharedPtrStateBase *pSStack_a0;
  MatrixOrder local_98;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  TestNode *local_48;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar3 = parentStructure->m_ptr;
  NVar1 = pNVar3->m_type;
  local_48 = &targetGroup->super_TestNode;
  local_40 = context;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    pSVar4 = parentStructure->m_state;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 1;
    pSStack_50 = (SharedPtrStateBase *)0x0;
    local_58 = pNVar6;
    pSStack_50 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_50->strongRefCount = 0;
    pSStack_50->weakRefCount = 0;
    pSStack_50->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSStack_50[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSStack_50->strongRefCount = 1;
    pSStack_50->weakRefCount = 1;
  }
  else {
    pSStack_50 = parentStructure->m_state;
    local_58 = pNVar3;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSStack_50->weakRefCount = pSStack_50->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskLastStage(presentShadersMask);
  if (((NVar1 == TYPE_DEFAULT_BLOCK) && (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION)) &&
     ((SVar2 & ~SHADERTYPE_GEOMETRY) != SHADERTYPE_VERTEX)) {
    if (SVar2 != SHADERTYPE_TESSELLATION_CONTROL) {
      if (SVar2 != SHADERTYPE_FRAGMENT) goto LAB_015aa2e3;
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar3->m_type = TYPE_VARIABLE;
      (pNVar3->m_enclosingNode).m_ptr = local_58;
      (pNVar3->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_a0 = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_78,
                 "var");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
      pdVar7 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
      pNVar3 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = local_58;
      (pNVar3->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
      pNVar3[1]._vptr_Node = (_func_int **)local_a8;
      *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_78.m_state = pSVar4;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar3;
      (pNVar6->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar6;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_a0 = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
      pdVar7 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar7 = &(local_78.m_state)->strongRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          local_78.m_ptr = (Node *)0x0;
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar7 = &(local_78.m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          if (local_78.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_78.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar3->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar3->m_enclosingNode).m_ptr = local_58;
      (pNVar3->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_a0 = pSVar4;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar6->m_type = TYPE_VARIABLE;
      (pNVar6->m_enclosingNode).m_ptr = pNVar3;
      (pNVar6->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar6;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_78.m_state = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
      pdVar7 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_78.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar7 = &pSStack_a0->strongRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          local_a8 = (undefined1  [8])0x0;
          (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar7 = &pSStack_a0->weakRefCount;
        *pdVar7 = *pdVar7 + -1;
        UNLOCK();
        if (*pdVar7 == 0) {
          if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
            (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
          }
          pSStack_a0 = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar3 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a8,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = local_58;
      (pNVar3->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar7 = *pdVar7 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
      pNVar3[1]._vptr_Node = (_func_int **)local_a8;
      *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_78.m_state = pSVar4;
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar6->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar6->m_enclosingNode).m_ptr = pNVar3;
      (pNVar6->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar6[1]._vptr_Node = 0xffffffff;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar6;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      pSStack_a0 = pSVar4;
      pNVar3 = (Node *)operator_new(0x28);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar3->m_type = TYPE_VARIABLE;
      (pNVar3->m_enclosingNode).m_ptr = pNVar6;
      (pNVar3->m_enclosingNode).m_state = pSVar4;
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_88.m_state = pSVar4;
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
                 "var_array_explicit_location");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
      goto LAB_015a901d;
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 6;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,"var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 0xfffffffe;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar6;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar5,local_40,&local_68,&local_38,"var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_68.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_88.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_88.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
               "patch_var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_a0->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_a0->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_88.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_88.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_struct");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x20);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_STRUCT_MEMBER;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar6;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_68,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_68.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_88.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_88.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_array");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar3->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar6;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_68.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_68,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_68.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_88.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_88.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  else {
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_78,
               "var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_a0->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
               "var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_a0->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_78.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_78.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x20);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_STRUCT_MEMBER;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_struct");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_78.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x20);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_STRUCT_MEMBER;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar6;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &(local_78.m_state)->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &(local_78.m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_78.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar3 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar3->m_enclosingNode).m_ptr = local_58;
    (pNVar3->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar3[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_78.m_state = pSVar4;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar6->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar6->m_enclosingNode).m_ptr = pNVar3;
    (pNVar6->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar6;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pSStack_a0 = pSVar4;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar6;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_88.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar5,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_array_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar5);
LAB_015a901d:
    pdVar7 = &pSVar4->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_a0->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_a0->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &(local_78.m_state)->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_78.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
LAB_015aa2e3:
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &pSStack_50->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_50->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if ((*pdVar7 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramOutputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	output			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_OUT)))
																	: (parentStructure);
	const glu::ShaderType						lastStage		= getShaderMaskLastStage(presentShadersMask);

	if (lastStage == glu::SHADERTYPE_VERTEX						||
		lastStage == glu::SHADERTYPE_GEOMETRY					||
		lastStage == glu::SHADERTYPE_TESSELLATION_EVALUATION	||
		!inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_FRAGMENT)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(output, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(1)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchOutput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_OUT));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(output, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use array of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchOutput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchOutput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchOutput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_OUTPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (lastStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}